

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_77::LimitedInputStream::decreaseLimit
          (LimitedInputStream *this,uint64_t amount,uint64_t requested)

{
  AsyncInputStream *pAVar1;
  Disposer *pDVar2;
  uint64_t uVar3;
  Fault f;
  Fault f_1;
  Fault local_20;
  Fault local_18;
  undefined8 uStack_10;
  
  uVar3 = this->limit - amount;
  if (this->limit < amount) {
    local_20.exception = (Exception *)0x0;
    local_18.exception = (Exception *)0x0;
    uStack_10 = 0;
    kj::_::Debug::Fault::init
              (&local_20,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
              );
    kj::_::Debug::Fault::fatal(&local_20);
  }
  this->limit = uVar3;
  if (uVar3 == 0) {
    pAVar1 = (this->inner).ptr;
    if (pAVar1 != (AsyncInputStream *)0x0) {
      (this->inner).ptr = (AsyncInputStream *)0x0;
      pDVar2 = (this->inner).disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,pAVar1->_vptr_AsyncInputStream[-2] + (long)&pAVar1->_vptr_AsyncInputStream);
      return;
    }
  }
  else if (amount < requested) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x494,FAILED,(char *)0x0,"\"pipe ended prematurely\"",
               (char (*) [23])"pipe ended prematurely");
    kj::_::Debug::Fault::fatal(&local_18);
  }
  return;
}

Assistant:

void decreaseLimit(uint64_t amount, uint64_t requested) {
    KJ_ASSERT(limit >= amount);
    limit -= amount;
    if (limit == 0) {
      inner = nullptr;
    } else if (amount < requested) {
      KJ_FAIL_REQUIRE("pipe ended prematurely");
    }
  }